

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O2

Constant *
spvtools::opt::anon_unknown_0::FoldScalarFPDivide
          (Type *result_type,Constant *numerator,Constant *denominator,ConstantManager *const_mgr)

{
  int iVar1;
  Constant *pCVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *__assertion;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  FloatProxy<float> result_in_macro;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words_in_macro;
  FloatProxy<double> local_40;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  if (denominator != (Constant *)0x0) {
    iVar1 = (*denominator->_vptr_Constant[0x17])(denominator);
    if ((char)iVar1 != '\0') {
      pCVar2 = FoldFPScalarDivideByZero(result_type,numerator,const_mgr);
      return pCVar2;
    }
    iVar1 = (*denominator->type_->_vptr_Type[0xc])();
    iVar1 = *(int *)(CONCAT44(extraout_var,iVar1) + 0x24);
    if ((iVar1 == 0x40) || (iVar1 == 0x20)) {
      iVar1 = (*denominator->_vptr_Constant[0xf])(denominator);
      if (CONCAT44(extraout_var_00,iVar1) != 0) {
        dVar5 = analysis::Constant::GetValueAsDouble(denominator);
        if ((dVar5 == 0.0) && (!NAN(dVar5))) {
          pCVar2 = FoldFPScalarDivideByZero(result_type,numerator,const_mgr);
          if (pCVar2 == (Constant *)0x0) {
            return (Constant *)0x0;
          }
          pCVar2 = NegateFPConst(result_type,pCVar2,const_mgr);
          return pCVar2;
        }
      }
      if ((result_type == (Type *)0x0) || (numerator == (Constant *)0x0)) {
        __assertion = "result_type_in_macro != nullptr && a != nullptr && b != nullptr";
      }
      else if ((numerator->type_ == result_type) && (denominator->type_ == result_type)) {
        iVar1 = (*result_type->_vptr_Type[0xc])(result_type);
        if (CONCAT44(extraout_var_01,iVar1) != 0) {
          iVar1 = *(int *)(CONCAT44(extraout_var_01,iVar1) + 0x24);
          if (iVar1 == 0x40) {
            dVar5 = analysis::Constant::GetDouble(numerator);
            dVar6 = analysis::Constant::GetDouble(denominator);
            local_40.data_ = (uint_type)(dVar5 / dVar6);
            utils::FloatProxy<double>::GetWords
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,&local_40);
          }
          else {
            if (iVar1 != 0x20) {
              return (Constant *)0x0;
            }
            fVar3 = analysis::Constant::GetFloat(numerator);
            fVar4 = analysis::Constant::GetFloat(denominator);
            local_40.data_._0_4_ = fVar3 / fVar4;
            utils::FloatProxy<float>::GetWords
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,
                       (FloatProxy<float> *)&local_40);
          }
          pCVar2 = analysis::ConstantManager::GetConstant
                             (const_mgr,result_type,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
          return pCVar2;
        }
        __assertion = "float_type_in_macro != nullptr";
      }
      else {
        __assertion = "result_type_in_macro == a->type() && result_type_in_macro == b->type()";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                    ,0x411,
                    "auto spvtools::opt::(anonymous namespace)::FoldScalarFPDivide(const analysis::Type *, const analysis::Constant *, const analysis::Constant *, analysis::ConstantManager *)::(anonymous class)::operator()(const analysis::Type *, const analysis::Constant *, const analysis::Constant *, analysis::ConstantManager *) const"
                   );
    }
  }
  return (Constant *)0x0;
}

Assistant:

const analysis::Constant* FoldScalarFPDivide(
    const analysis::Type* result_type, const analysis::Constant* numerator,
    const analysis::Constant* denominator,
    analysis::ConstantManager* const_mgr) {
  if (denominator == nullptr) {
    return nullptr;
  }

  if (denominator->IsZero()) {
    return FoldFPScalarDivideByZero(result_type, numerator, const_mgr);
  }

  uint32_t width = denominator->type()->AsFloat()->width();
  if (width != 32 && width != 64) {
    return nullptr;
  }

  const analysis::FloatConstant* denominator_float =
      denominator->AsFloatConstant();
  if (denominator_float && denominator->GetValueAsDouble() == -0.0) {
    const analysis::Constant* result =
        FoldFPScalarDivideByZero(result_type, numerator, const_mgr);
    if (result != nullptr)
      result = NegateFPConst(result_type, result, const_mgr);
    return result;
  } else {
    return FOLD_FPARITH_OP(/)(result_type, numerator, denominator, const_mgr);
  }
}